

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_message.hpp
# Opt level: O2

void __thiscall
Catch::Capturer::captureValues<unsigned_int,char[9],__va_list_tag[1]>
          (Capturer *this,size_t index,uint *value,char (*values) [9],__va_list_tag (*values_1) [1])

{
  string sStack_48;
  
  Detail::stringify<unsigned_int>(&sStack_48,value);
  captureValue(this,index,&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  captureValues<char[9],__va_list_tag[1]>(this,index + 1,values,values_1);
  return;
}

Assistant:

void captureValues( size_t index, T const& value, Ts const&... values ) {
            captureValue( index, Catch::Detail::stringify(value) );
            captureValues( index+1, values... );
        }